

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int cram_write_SAM_hdr(cram_fd *fd,SAM_hdr *hdr)

{
  size_t sVar1;
  int64_t iVar2;
  hFILE *fp;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  SAM_RG *pSVar7;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar8;
  char *pcVar9;
  ssize_t sVar10;
  cram_block *b_00;
  cram_container *c_00;
  uchar *puVar11;
  int32_t *piVar12;
  void *__src;
  int32_t iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double local_1210;
  double local_1208;
  int local_1200;
  int local_11fc;
  int local_11f8;
  int local_11f0;
  int local_11ec;
  int local_11e8;
  int local_11e0;
  int local_11dc;
  int local_11d8;
  double local_11d0;
  int local_11c8;
  int local_11c4;
  int local_11c0;
  int local_11b8;
  int local_11b4;
  int local_11b0;
  double local_11a8;
  int local_11a0;
  int local_119c;
  int local_1198;
  int local_1190;
  int local_118c;
  int local_1188;
  int local_1180;
  int local_117c;
  int local_1178;
  double local_1168;
  uint local_1150;
  int method;
  int is_cram_3;
  char *pads;
  int padded_length;
  cram_container *c;
  cram_block *b;
  char ref_fn [4096];
  MD5_CTX md5;
  int rlen;
  int j;
  uchar buf2 [33];
  byte local_58 [8];
  uchar buf [16];
  char *ref;
  SAM_hdr_type *ty;
  int i;
  int blank_block;
  int header_len;
  SAM_hdr *hdr_local;
  cram_fd *fd_local;
  
  bVar3 = 2 < fd->version >> 8;
  if (fd->file_def->major_version == '\0') {
    fd->file_def->major_version = (uint8_t)((uint)fd->version >> 8);
    fd->file_def->minor_version = (uint8_t)fd->version;
    iVar4 = cram_write_file_def(fd,fd->file_def);
    if (iVar4 != 0) {
      return -1;
    }
  }
  if (((fd->version >> 8 == 1) && (pSVar7 = sam_hdr_find_rg(hdr,"UNKNOWN"), pSVar7 == (SAM_RG *)0x0)
      ) && (iVar4 = sam_hdr_add(hdr,"RG","ID","UNKNOWN","SM","UNKNOWN",0), iVar4 != 0)) {
    fd_local._4_4_ = -1;
  }
  else {
    if ((fd->refs != (refs_t *)0x0) && (fd->no_ref == 0)) {
      for (ty._4_4_ = 0; ty._4_4_ < hdr->nref; ty._4_4_ = ty._4_4_ + 1) {
        type = sam_hdr_find(hdr,"SQ","SN",hdr->ref[ty._4_4_].name);
        if (type == (SAM_hdr_type *)0x0) {
          return -1;
        }
        pSVar8 = sam_hdr_find_key(hdr,type,"M5",(SAM_hdr_tag **)0x0);
        if (pSVar8 == (SAM_hdr_tag *)0x0) {
          if (((fd->refs == (refs_t *)0x0) || (fd->refs->ref_id == (ref_entry **)0x0)) ||
             (fd->refs->ref_id[ty._4_4_] == (ref_entry *)0x0)) {
            return -1;
          }
          iVar2 = fd->refs->ref_id[ty._4_4_]->length;
          MD5_Init((MD5_CTX *)(ref_fn + 0xff8));
          pcVar9 = cram_get_ref(fd,ty._4_4_,1,(int)iVar2);
          if (pcVar9 == (char *)0x0) {
            return -1;
          }
          MD5_Update((MD5_CTX *)(ref_fn + 0xff8),pcVar9,
                     (long)(int)fd->refs->ref_id[ty._4_4_]->length);
          MD5_Final(local_58,(MD5_CTX *)(ref_fn + 0xff8));
          cram_ref_decr(fd->refs,ty._4_4_);
          for (md5.block[0xf] = 0; (int)md5.block[0xf] < 0x10; md5.block[0xf] = md5.block[0xf] + 1)
          {
            *(char *)((long)&rlen + (long)(int)(md5.block[0xf] << 1)) =
                 "0123456789abcdef"[(int)(uint)local_58[(int)md5.block[0xf]] >> 4];
            *(char *)((long)&rlen + (long)(int)(md5.block[0xf] * 2 + 1)) =
                 "0123456789abcdef"[(int)(local_58[(int)md5.block[0xf]] & 0xf)];
          }
          buf2[0x18] = '\0';
          iVar4 = sam_hdr_update(hdr,type,"M5",&rlen,0);
          if (iVar4 != 0) {
            return -1;
          }
        }
        if (fd->ref_fn != (char *)0x0) {
          full_path((char *)&b,fd->ref_fn);
          iVar4 = sam_hdr_update(hdr,type,"UR",&b,0);
          if (iVar4 != 0) {
            return -1;
          }
        }
      }
    }
    iVar4 = sam_hdr_rebuild(hdr);
    if (iVar4 == 0) {
      iVar4 = sam_hdr_length(hdr);
      if (fd->version >> 8 == 1) {
        iVar5 = int32_encode(fd,iVar4);
        if (iVar5 == -1) {
          return -1;
        }
        fp = fd->fp;
        pcVar9 = sam_hdr_str(hdr);
        sVar10 = hwrite(fp,pcVar9,(long)iVar4);
        if (iVar4 != sVar10) {
          return -1;
        }
      }
      else {
        b_00 = cram_new_block(FILE_HEADER,0);
        c_00 = cram_new_container(0,0);
        uVar6 = (uint)(2 < fd->version >> 8);
        if ((b_00 == (cram_block *)0x0) || (c_00 == (cram_container *)0x0)) {
          if (b_00 != (cram_block *)0x0) {
            cram_free_block(b_00);
          }
          if (c_00 != (cram_container *)0x0) {
            cram_free_container(c_00);
          }
          return -1;
        }
        int32_put(b_00,iVar4);
        while (b_00->alloc <= b_00->byte + (long)iVar4) {
          if (b_00->alloc == 0) {
            local_1168 = 1024.0;
          }
          else {
            sVar1 = b_00->alloc;
            auVar14._8_4_ = (int)(sVar1 >> 0x20);
            auVar14._0_8_ = sVar1;
            auVar14._12_4_ = 0x45300000;
            local_1168 = ((auVar14._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
          }
          b_00->alloc = (long)local_1168 |
                        (long)(local_1168 - 9.223372036854776e+18) & (long)local_1168 >> 0x3f;
          puVar11 = (uchar *)realloc(b_00->data,b_00->alloc);
          b_00->data = puVar11;
        }
        puVar11 = b_00->data;
        sVar1 = b_00->byte;
        pcVar9 = sam_hdr_str(hdr);
        memcpy(puVar11 + sVar1,pcVar9,(long)iVar4);
        b_00->byte = (long)iVar4 + b_00->byte;
        iVar13 = (int32_t)b_00->byte;
        b_00->uncomp_size = iVar13;
        b_00->comp_size = iVar13;
        if ((2 < fd->version >> 8) && (0 < fd->level)) {
          local_1150 = 2;
          if (fd->use_bz2 != 0) {
            local_1150 = 6;
          }
          if (fd->use_lzma != 0) {
            local_1150 = local_1150 | 8;
          }
          cram_compress_block(fd,b_00,(cram_metrics *)0x0,local_1150,fd->level);
        }
        if (bVar3) {
          if ((b_00->content_id & 0xffffff80U) == 0) {
            local_1178 = 1;
          }
          else {
            if ((b_00->content_id & 0xffffc000U) == 0) {
              local_117c = 2;
            }
            else {
              if ((b_00->content_id & 0xffe00000U) == 0) {
                local_1180 = 3;
              }
              else {
                local_1180 = 5;
                if ((b_00->content_id & 0xf0000000U) == 0) {
                  local_1180 = 4;
                }
              }
              local_117c = local_1180;
            }
            local_1178 = local_117c;
          }
          if ((b_00->uncomp_size & 0xffffff80U) == 0) {
            local_1188 = 1;
          }
          else {
            if ((b_00->uncomp_size & 0xffffc000U) == 0) {
              local_118c = 2;
            }
            else {
              if ((b_00->uncomp_size & 0xffe00000U) == 0) {
                local_1190 = 3;
              }
              else {
                local_1190 = 5;
                if ((b_00->uncomp_size & 0xf0000000U) == 0) {
                  local_1190 = 4;
                }
              }
              local_118c = local_1190;
            }
            local_1188 = local_118c;
          }
          if ((b_00->comp_size & 0xffffff80U) == 0) {
            local_1198 = 1;
          }
          else {
            if ((b_00->comp_size & 0xffffc000U) == 0) {
              local_119c = 2;
            }
            else {
              if ((b_00->comp_size & 0xffe00000U) == 0) {
                local_11a0 = 3;
              }
              else {
                local_11a0 = 5;
                if ((b_00->comp_size & 0xf0000000U) == 0) {
                  local_11a0 = 4;
                }
              }
              local_119c = local_11a0;
            }
            local_1198 = local_119c;
          }
          c_00->length = b_00->comp_size + 2 + uVar6 * 4 + local_1178 + local_1188 + local_1198;
          c_00->num_blocks = 2;
          c_00->num_landmarks = 2;
          piVar12 = (int32_t *)malloc(8);
          c_00->landmark = piVar12;
          if (piVar12 == (int32_t *)0x0) {
            cram_free_block(b_00);
            cram_free_container(c_00);
            return -1;
          }
          *c_00->landmark = 0;
          c_00->landmark[1] = c_00->length;
          if (10000.0 <= (double)c_00->length * 0.5) {
            local_11a8 = 10000.0;
          }
          else {
            local_11a8 = (double)c_00->length * 0.5;
          }
          pads._4_4_ = (uint)local_11a8;
          if ((b_00->content_id & 0xffffff80U) == 0) {
            local_11b0 = 1;
          }
          else {
            if ((b_00->content_id & 0xffffc000U) == 0) {
              local_11b4 = 2;
            }
            else {
              if ((b_00->content_id & 0xffe00000U) == 0) {
                local_11b8 = 3;
              }
              else {
                local_11b8 = 5;
                if ((b_00->content_id & 0xf0000000U) == 0) {
                  local_11b8 = 4;
                }
              }
              local_11b4 = local_11b8;
            }
            local_11b0 = local_11b4;
          }
          if ((pads._4_4_ & 0xffffff80) == 0) {
            local_11c0 = 1;
          }
          else {
            if ((pads._4_4_ & 0xffffc000) == 0) {
              local_11c4 = 2;
            }
            else {
              if ((pads._4_4_ & 0xffe00000) == 0) {
                local_11c8 = 3;
              }
              else {
                local_11c8 = 5;
                if ((pads._4_4_ & 0xf0000000) == 0) {
                  local_11c8 = 4;
                }
              }
              local_11c4 = local_11c8;
            }
            local_11c0 = local_11c4;
          }
          c_00->length = pads._4_4_ + 2 + uVar6 * 4 + local_11b0 + local_11c0 * 2 + c_00->length;
        }
        else {
          c_00->num_blocks = 1;
          c_00->num_landmarks = 1;
          piVar12 = (int32_t *)malloc(4);
          c_00->landmark = piVar12;
          if (piVar12 == (int32_t *)0x0) {
            return -1;
          }
          *c_00->landmark = 0;
          if ((double)c_00->length * 1.5 <= 10000.0) {
            local_11d0 = 10000.0;
          }
          else {
            local_11d0 = (double)c_00->length * 1.5;
          }
          pads._4_4_ = (uint)(local_11d0 - (double)c_00->length);
          if ((b_00->content_id & 0xffffff80U) == 0) {
            local_11d8 = 1;
          }
          else {
            if ((b_00->content_id & 0xffffc000U) == 0) {
              local_11dc = 2;
            }
            else {
              if ((b_00->content_id & 0xffe00000U) == 0) {
                local_11e0 = 3;
              }
              else {
                local_11e0 = 5;
                if ((b_00->content_id & 0xf0000000U) == 0) {
                  local_11e0 = 4;
                }
              }
              local_11dc = local_11e0;
            }
            local_11d8 = local_11dc;
          }
          if ((b_00->uncomp_size & 0xffffff80U) == 0) {
            local_11e8 = 1;
          }
          else {
            if ((b_00->uncomp_size & 0xffffc000U) == 0) {
              local_11ec = 2;
            }
            else {
              if ((b_00->uncomp_size & 0xffe00000U) == 0) {
                local_11f0 = 3;
              }
              else {
                local_11f0 = 5;
                if ((b_00->uncomp_size & 0xf0000000U) == 0) {
                  local_11f0 = 4;
                }
              }
              local_11ec = local_11f0;
            }
            local_11e8 = local_11ec;
          }
          if ((b_00->comp_size & 0xffffff80U) == 0) {
            local_11f8 = 1;
          }
          else {
            if ((b_00->comp_size & 0xffffc000U) == 0) {
              local_11fc = 2;
            }
            else {
              if ((b_00->comp_size & 0xffe00000U) == 0) {
                local_1200 = 3;
              }
              else {
                local_1200 = 5;
                if ((b_00->comp_size & 0xf0000000U) == 0) {
                  local_1200 = 4;
                }
              }
              local_11fc = local_1200;
            }
            local_11f8 = local_11fc;
          }
          c_00->length = b_00->comp_size + pads._4_4_ + 2 + uVar6 * 4 + local_11d8 + local_11e8 +
                         local_11f8;
          __src = calloc(1,(long)(int)pads._4_4_);
          if (__src == (void *)0x0) {
            cram_free_block(b_00);
            cram_free_container(c_00);
            return -1;
          }
          while (b_00->alloc <= b_00->byte + (long)(int)pads._4_4_) {
            if (b_00->alloc == 0) {
              local_1208 = 1024.0;
            }
            else {
              sVar1 = b_00->alloc;
              auVar15._8_4_ = (int)(sVar1 >> 0x20);
              auVar15._0_8_ = sVar1;
              auVar15._12_4_ = 0x45300000;
              local_1208 = ((auVar15._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
            }
            b_00->alloc = (long)local_1208 |
                          (long)(local_1208 - 9.223372036854776e+18) & (long)local_1208 >> 0x3f;
            puVar11 = (uchar *)realloc(b_00->data,b_00->alloc);
            b_00->data = puVar11;
          }
          memcpy(b_00->data + b_00->byte,__src,(long)(int)pads._4_4_);
          b_00->byte = (long)(int)pads._4_4_ + b_00->byte;
          iVar13 = (int32_t)b_00->byte;
          b_00->uncomp_size = iVar13;
          b_00->comp_size = iVar13;
          free(__src);
        }
        iVar4 = cram_write_container(fd,c_00);
        if (iVar4 == -1) {
          cram_free_block(b_00);
          cram_free_container(c_00);
          return -1;
        }
        iVar4 = cram_write_block(fd,b_00);
        if (iVar4 == -1) {
          cram_free_block(b_00);
          cram_free_container(c_00);
          return -1;
        }
        if (bVar3) {
          while (b_00->alloc <= (ulong)(long)(int)pads._4_4_) {
            if (b_00->alloc == 0) {
              local_1210 = 1024.0;
            }
            else {
              sVar1 = b_00->alloc;
              auVar16._8_4_ = (int)(sVar1 >> 0x20);
              auVar16._0_8_ = sVar1;
              auVar16._12_4_ = 0x45300000;
              local_1210 = ((auVar16._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0)) * 1.5;
            }
            b_00->alloc = (long)local_1210 |
                          (long)(local_1210 - 9.223372036854776e+18) & (long)local_1210 >> 0x3f;
            puVar11 = (uchar *)realloc(b_00->data,b_00->alloc);
            b_00->data = puVar11;
          }
          memset(b_00->data,0,(long)(int)pads._4_4_);
          b_00->byte = (long)(int)pads._4_4_;
          iVar13 = (int32_t)b_00->byte;
          b_00->uncomp_size = iVar13;
          b_00->comp_size = iVar13;
          b_00->method = RAW;
          iVar4 = cram_write_block(fd,b_00);
          if (iVar4 == -1) {
            cram_free_block(b_00);
            cram_free_container(c_00);
            return -1;
          }
        }
        cram_free_block(b_00);
        cram_free_container(c_00);
      }
      iVar4 = refs_from_header(fd->refs,fd,fd->header);
      if (iVar4 == -1) {
        fd_local._4_4_ = -1;
      }
      else {
        iVar4 = refs2id(fd->refs,fd->header);
        if (iVar4 == -1) {
          fd_local._4_4_ = -1;
        }
        else {
          iVar4 = hflush(fd->fp);
          if (iVar4 == 0) {
            fd_local._4_4_ = 0;
          }
          else {
            fd_local._4_4_ = -1;
          }
        }
      }
    }
    else {
      fd_local._4_4_ = -1;
    }
  }
  return fd_local._4_4_;
}

Assistant:

int cram_write_SAM_hdr(cram_fd *fd, SAM_hdr *hdr) {
    int header_len;
    int blank_block = (CRAM_MAJOR_VERS(fd->version) >= 3);

    /* Write CRAM MAGIC if not yet written. */
    if (fd->file_def->major_version == 0) {
	fd->file_def->major_version = CRAM_MAJOR_VERS(fd->version);
	fd->file_def->minor_version = CRAM_MINOR_VERS(fd->version);
	if (0 != cram_write_file_def(fd, fd->file_def))
	    return -1;
    }

    /* 1.0 requires and UNKNOWN read-group */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if (!sam_hdr_find_rg(hdr, "UNKNOWN"))
	    if (sam_hdr_add(hdr, "RG",
			    "ID", "UNKNOWN", "SM", "UNKNOWN", NULL))
		return -1;
    }

    /* Fix M5 strings */
    if (fd->refs && !fd->no_ref) {
	int i;
	for (i = 0; i < hdr->nref; i++) {
	    SAM_hdr_type *ty;
	    char *ref;

	    if (!(ty = sam_hdr_find(hdr, "SQ", "SN", hdr->ref[i].name)))
		return -1;

	    if (!sam_hdr_find_key(hdr, ty, "M5", NULL)) {
		char unsigned buf[16], buf2[33];
		int j, rlen;
		MD5_CTX md5;

		if (!fd->refs ||
		    !fd->refs->ref_id ||
		    !fd->refs->ref_id[i]) {
		    return -1;
		}
		rlen = fd->refs->ref_id[i]->length;
		MD5_Init(&md5);
		ref = cram_get_ref(fd, i, 1, rlen);
		if (NULL == ref) return -1;
		rlen = fd->refs->ref_id[i]->length; /* In case it just loaded */
		MD5_Update(&md5, ref, rlen);
		MD5_Final(buf, &md5);
		cram_ref_decr(fd->refs, i);

		for (j = 0; j < 16; j++) {
		    buf2[j*2+0] = "0123456789abcdef"[buf[j]>>4];
		    buf2[j*2+1] = "0123456789abcdef"[buf[j]&15];
		}
		buf2[32] = 0;
		if (sam_hdr_update(hdr, ty, "M5", buf2, NULL))
		    return -1;
	    }

	    if (fd->ref_fn) {
		char ref_fn[PATH_MAX];
		full_path(ref_fn, fd->ref_fn);
		if (sam_hdr_update(hdr, ty, "UR", ref_fn, NULL))
		    return -1;
	    }
	}
    }

    if (sam_hdr_rebuild(hdr))
	return -1;

    /* Length */
    header_len = sam_hdr_length(hdr);
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if (-1 == int32_encode(fd, header_len))
	    return -1;

	/* Text data */
	if (header_len != hwrite(fd->fp, sam_hdr_str(hdr), header_len))
	    return -1;
    } else {
	/* Create block(s) inside a container */
	cram_block *b = cram_new_block(FILE_HEADER, 0);
	cram_container *c = cram_new_container(0, 0);
	int padded_length;
	char *pads;
	int is_cram_3 = (CRAM_MAJOR_VERS(fd->version) >= 3);

	if (!b || !c) {
	    if (b) cram_free_block(b);
	    if (c) cram_free_container(c);
	    return -1;
	}

	int32_put(b, header_len);
	BLOCK_APPEND(b, sam_hdr_str(hdr), header_len);
	BLOCK_UPLEN(b);

	// Compress header block if V3.0 and above
	if (CRAM_MAJOR_VERS(fd->version) >= 3 && fd->level > 0) {
	    int method = 1<<GZIP;
	    if (fd->use_bz2)
		method |= 1<<BZIP2;
	    if (fd->use_lzma)
		method |= 1<<LZMA;
	    cram_compress_block(fd, b, NULL, method, fd->level);
	} 

	if (blank_block) {
	    c->length = b->comp_size + 2 + 4*is_cram_3 +
		itf8_size(b->content_id)   + 
		itf8_size(b->uncomp_size)  +
		itf8_size(b->comp_size);

	    c->num_blocks = 2;
	    c->num_landmarks = 2;
	    if (!(c->landmark = malloc(2*sizeof(*c->landmark)))) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	    c->landmark[0] = 0;
	    c->landmark[1] = c->length;

	    // Plus extra storage for uncompressed secondary blank block
	    padded_length = MIN(c->length*.5, 10000);
	    c->length += padded_length + 2 + 4*is_cram_3 +
		itf8_size(b->content_id) + 
		itf8_size(padded_length)*2;
	} else {
	    // Pad the block instead.
	    c->num_blocks = 1;
	    c->num_landmarks = 1;
	    if (!(c->landmark = malloc(sizeof(*c->landmark))))
		return -1;
	    c->landmark[0] = 0;

	    padded_length = MAX(c->length*1.5, 10000) - c->length;

	    c->length = b->comp_size + padded_length +
		2 + 4*is_cram_3 +
		itf8_size(b->content_id)   + 
		itf8_size(b->uncomp_size)  +
		itf8_size(b->comp_size);

	    if (NULL == (pads = calloc(1, padded_length))) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	    BLOCK_APPEND(b, pads, padded_length);
	    BLOCK_UPLEN(b);
	    free(pads);
	}

	if (-1 == cram_write_container(fd, c)) {
	    cram_free_block(b);
	    cram_free_container(c);
	    return -1;
	}

	if (-1 == cram_write_block(fd, b)) {
	    cram_free_block(b);
	    cram_free_container(c);
	    return -1;
	}

	if (blank_block) {
	    BLOCK_RESIZE(b, padded_length);
	    memset(BLOCK_DATA(b), 0, padded_length);
	    BLOCK_SIZE(b) = padded_length;
	    BLOCK_UPLEN(b);
	    b->method = RAW;
	    if (-1 == cram_write_block(fd, b)) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	}

	cram_free_block(b);
	cram_free_container(c);
    }

    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	return -1;
    if (-1 == refs2id(fd->refs, fd->header))
	return -1;

    if (0 != hflush(fd->fp))
	return -1;

    RP("=== Finishing saving header ===\n");

    return 0;
}